

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O1

void __thiscall Manifold_MultiCompose_Test::TestBody(Manifold_MultiCompose_Test *this)

{
  double dVar1;
  long lVar2;
  char *message;
  initializer_list<manifold::Manifold> __l;
  initializer_list<manifold::Manifold> __l_00;
  Manifold part;
  AssertionResult gtest_ar;
  Manifold finalAssembly;
  allocator_type local_151;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> local_150;
  AssertHelper local_138 [2];
  vector local_128 [16];
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  allocator_type local_d8 [16];
  Manifold local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  local_88 = 0x4024000000000000;
  uStack_80 = 0x4024000000000000;
  local_78 = 0x4024000000000000;
  manifold::Manifold::Cube(&local_150,0);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_150;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)local_118,__l,
             local_d8);
  manifold::Manifold::Compose(local_128);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)local_118);
  manifold::Manifold::~Manifold((Manifold *)&local_150);
  manifold::Manifold::Manifold((Manifold *)local_118,(Manifold *)local_128);
  local_a0 = 0;
  uStack_98 = 0x4024000000000000;
  local_90 = 0;
  manifold::Manifold::Translate(local_108,local_128);
  local_40 = 0x3ff0000000000000;
  uStack_38 = 0;
  uStack_30 = 0;
  manifold::Manifold::Mirror(local_138,local_128);
  local_58 = 0x4024000000000000;
  uStack_50 = 0;
  uStack_48 = 0;
  manifold::Manifold::Translate(local_f8,local_138);
  local_70 = 0x3ff0000000000000;
  uStack_68 = 0;
  uStack_60 = 0;
  manifold::Manifold::Mirror(local_c8,local_128);
  local_b8 = 0x4024000000000000;
  uStack_b0 = 0x4024000000000000;
  local_a8 = 0;
  manifold::Manifold::Translate(local_e8,local_c8);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_118;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            (&local_150,__l_00,&local_151);
  manifold::Manifold::Compose((vector *)local_d8);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&local_150);
  lVar2 = 0x30;
  do {
    manifold::Manifold::~Manifold((Manifold *)(local_118 + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -0x10);
  manifold::Manifold::~Manifold(local_c8);
  manifold::Manifold::~Manifold((Manifold *)local_138);
  dVar1 = (double)manifold::Manifold::Volume();
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_118,"finalAssembly.Volume()","4000",(float)dVar1,4000.0);
  if (local_118[0] == (Manifold)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x31e,message);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if (local_150.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_150.
                            super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  manifold::Manifold::~Manifold((Manifold *)local_d8);
  manifold::Manifold::~Manifold((Manifold *)local_128);
  return;
}

Assistant:

TEST(Manifold, MultiCompose) {
  auto part = Manifold::Compose({Manifold::Cube({10, 10, 10})});
  auto finalAssembly =
      Manifold::Compose({part, part.Translate({0, 10, 0}),
                         part.Mirror({1, 0, 0}).Translate({10, 0, 0}),
                         part.Mirror({1, 0, 0}).Translate({10, 10, 0})});
  EXPECT_FLOAT_EQ(finalAssembly.Volume(), 4000);
}